

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcContain.c
# Opt level: O0

int Mvc_CoverContain(Mvc_Cover_t *pCover)

{
  int iVar1;
  int iVar2;
  int nCubes;
  Mvc_Cover_t *pCover_local;
  
  iVar1 = Mvc_CoverReadCubeNum(pCover);
  if (iVar1 < 2) {
    pCover_local._4_4_ = 0;
  }
  else {
    Mvc_CoverSetCubeSizes(pCover);
    Mvc_CoverSort(pCover,(Mvc_Cube_t *)0x0,Mvc_CubeCompareSizeAndInt);
    Mvc_CoverRemoveDuplicates(pCover);
    if (1 < iVar1) {
      Mvc_CoverRemoveContained(pCover);
    }
    iVar2 = Mvc_CoverReadCubeNum(pCover);
    pCover_local._4_4_ = (uint)(iVar1 != iVar2);
  }
  return pCover_local._4_4_;
}

Assistant:

int  Mvc_CoverContain( Mvc_Cover_t * pCover )
{
    int nCubes;
    nCubes = Mvc_CoverReadCubeNum( pCover );
    if ( nCubes < 2 )
        return 0;
    Mvc_CoverSetCubeSizes(pCover);
    Mvc_CoverSort( pCover, NULL, Mvc_CubeCompareSizeAndInt );
    Mvc_CoverRemoveDuplicates( pCover );
    if ( nCubes > 1 )
        Mvc_CoverRemoveContained( pCover );
    return (nCubes != Mvc_CoverReadCubeNum(pCover));
}